

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall
cmComputeLinkInformation::AddSharedDepItem
          (cmComputeLinkInformation *this,string *item,cmGeneratorTarget *tgt)

{
  bool bVar1;
  TargetType TVar2;
  char *pcVar3;
  ulong uVar4;
  char *local_100;
  char *soname;
  string soName;
  cmOrderDirectories *order;
  ArtifactType local_74;
  undefined1 local_70 [4];
  ArtifactType artifact;
  string lib;
  undefined1 local_40 [8];
  string file;
  cmGeneratorTarget *tgt_local;
  string *item_local;
  cmComputeLinkInformation *this_local;
  
  if (this->SharedDependencyMode == SharedDepModeNone) {
    return;
  }
  file.field_2._8_8_ = tgt;
  if (tgt == (cmGeneratorTarget *)0x0) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    bVar1 = cmsys::SystemTools::FileIsFullPath(pcVar3);
    if (!bVar1) {
      return;
    }
    cmsys::SystemTools::GetFilenameName((string *)local_40,item);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    bVar1 = cmsys::RegularExpression::find(&this->ExtractSharedLibraryName,pcVar3);
    lib.field_2._9_3_ = 0;
    lib.field_2._M_local_buf[8] = !bVar1;
    std::__cxx11::string::~string((string *)local_40);
    if (lib.field_2._8_4_ != 0) {
      return;
    }
  }
  else {
    TVar2 = cmGeneratorTarget::GetType(tgt);
    if (TVar2 != SHARED_LIBRARY) {
      return;
    }
  }
  if (this->SharedDependencyMode == SharedDepModeLink) {
    AddItem(this,item,(cmGeneratorTarget *)file.field_2._8_8_);
  }
  else {
    std::__cxx11::string::string((string *)local_70);
    if (file.field_2._8_8_ == 0) {
      std::__cxx11::string::operator=((string *)local_70,(string *)item);
      AddLibraryRuntimeInfo(this,(string *)local_70);
    }
    else {
      local_74 = this->UseImportLibrary & ImportLibraryArtifact;
      cmGeneratorTarget::GetFullPath
                ((string *)&order,(cmGeneratorTarget *)file.field_2._8_8_,&this->Config,local_74,
                 false);
      std::__cxx11::string::operator=((string *)local_70,(string *)&order);
      std::__cxx11::string::~string((string *)&order);
      AddLibraryRuntimeInfo(this,(string *)local_70,(cmGeneratorTarget *)file.field_2._8_8_);
    }
    soName.field_2._8_8_ = 0;
    if ((this->SharedDependencyMode == SharedDepModeLibDir) &&
       ((this->LinkWithRuntimePath & 1U) == 0)) {
      soName.field_2._8_8_ = this->OrderLinkerSearchPath;
    }
    else if (this->SharedDependencyMode == SharedDepModeDir) {
      soName.field_2._8_8_ = this->OrderDependentRPath;
    }
    if (soName.field_2._8_8_ != 0) {
      if (file.field_2._8_8_ == 0) {
        cmOrderDirectories::AddRuntimeLibrary
                  ((cmOrderDirectories *)soName.field_2._8_8_,(string *)local_70,(char *)0x0);
      }
      else {
        cmGeneratorTarget::GetSOName
                  ((string *)&soname,(cmGeneratorTarget *)file.field_2._8_8_,&this->Config);
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          local_100 = (char *)std::__cxx11::string::c_str();
        }
        else {
          local_100 = (char *)0x0;
        }
        cmOrderDirectories::AddRuntimeLibrary
                  ((cmOrderDirectories *)soName.field_2._8_8_,(string *)local_70,local_100);
        std::__cxx11::string::~string((string *)&soname);
      }
    }
    std::__cxx11::string::~string((string *)local_70);
  }
  return;
}

Assistant:

void cmComputeLinkInformation::AddSharedDepItem(std::string const& item,
                                                const cmGeneratorTarget* tgt)
{
  // If dropping shared library dependencies, ignore them.
  if (this->SharedDependencyMode == SharedDepModeNone) {
    return;
  }

  // The user may have incorrectly named an item.  Skip items that are
  // not full paths to shared libraries.
  if (tgt) {
    // The target will provide a full path.  Make sure it is a shared
    // library.
    if (tgt->GetType() != cmStateEnums::SHARED_LIBRARY) {
      return;
    }
  } else {
    // Skip items that are not full paths.  We will not be able to
    // reliably specify them.
    if (!cmSystemTools::FileIsFullPath(item.c_str())) {
      return;
    }

    // Get the name of the library from the file name.
    std::string file = cmSystemTools::GetFilenameName(item);
    if (!this->ExtractSharedLibraryName.find(file.c_str())) {
      // This is not the name of a shared library.
      return;
    }
  }

  // If in linking mode, just link to the shared library.
  if (this->SharedDependencyMode == SharedDepModeLink) {
    this->AddItem(item, tgt);
    return;
  }

  // Get a full path to the dependent shared library.
  // Add it to the runtime path computation so that the target being
  // linked will be able to find it.
  std::string lib;
  if (tgt) {
    cmStateEnums::ArtifactType artifact = this->UseImportLibrary
      ? cmStateEnums::ImportLibraryArtifact
      : cmStateEnums::RuntimeBinaryArtifact;
    lib = tgt->GetFullPath(this->Config, artifact);
    this->AddLibraryRuntimeInfo(lib, tgt);
  } else {
    lib = item;
    this->AddLibraryRuntimeInfo(lib);
  }

  // Check if we need to include the dependent shared library in other
  // path ordering.
  cmOrderDirectories* order = CM_NULLPTR;
  if (this->SharedDependencyMode == SharedDepModeLibDir &&
      !this->LinkWithRuntimePath /* AddLibraryRuntimeInfo adds it */) {
    // Add the item to the linker search path.
    order = this->OrderLinkerSearchPath;
  } else if (this->SharedDependencyMode == SharedDepModeDir) {
    // Add the item to the separate dependent library search path.
    order = this->OrderDependentRPath;
  }
  if (order) {
    if (tgt) {
      std::string soName = tgt->GetSOName(this->Config);
      const char* soname = soName.empty() ? CM_NULLPTR : soName.c_str();
      order->AddRuntimeLibrary(lib, soname);
    } else {
      order->AddRuntimeLibrary(lib);
    }
  }
}